

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterXsYs<long_long>,_ImPlot::GetterXsYRef<long_long>,_ImPlot::TransformerLinLin>
::operator()(LineSegmentsRenderer<ImPlot::GetterXsYs<long_long>,_ImPlot::GetterXsYRef<long_long>,_ImPlot::TransformerLinLin>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  ImVec2 IVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  ImU32 IVar6;
  uint uVar7;
  GetterXsYs<long_long> *pGVar8;
  GetterXsYRef<long_long> *pGVar9;
  ImDrawVert *pIVar10;
  ImDrawIdx *pIVar11;
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  ulong uVar15;
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  int iVar19;
  long lVar20;
  ImDrawIdx IVar21;
  ImPlotContext *gp;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  ulong uVar26;
  float fVar27;
  float fVar28;
  float fVar34;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  
  pGVar8 = this->Getter1;
  pGVar9 = this->Getter2;
  iVar19 = pGVar8->Count;
  iVar4 = this->Transformer->YAxis;
  iVar5 = pGVar9->Count;
  lVar20 = (long)(((pGVar8->Offset + prim) % iVar19 + iVar19) % iVar19) * (long)pGVar8->Stride;
  IVar1 = GImPlot->PixelRange[iVar4].Min;
  dVar13 = (double)IVar1.x;
  dVar14 = (double)IVar1.y;
  dVar2 = GImPlot->CurrentPlot->YAxis[iVar4].Range.Min;
  dVar3 = (GImPlot->CurrentPlot->XAxis).Range.Min;
  fVar22 = (float)(((double)*(long *)((long)pGVar8->Ys + lVar20) - dVar2) * GImPlot->My[iVar4] +
                  dVar14);
  fVar23 = (float)(((double)*(long *)((long)pGVar8->Xs + lVar20) - dVar3) * GImPlot->Mx + dVar13);
  fVar24 = (float)((pGVar9->YRef - dVar2) * GImPlot->My[iVar4] + dVar14);
  fVar25 = (float)(((double)*(long *)((long)pGVar9->Xs +
                                     (long)(((prim + pGVar9->Offset) % iVar5 + iVar5) % iVar5) *
                                     (long)pGVar9->Stride) - dVar3) * GImPlot->Mx + dVar13);
  uVar26 = CONCAT44(-(uint)(fVar25 <= fVar23),-(uint)(fVar24 <= fVar22));
  auVar16._4_8_ = dVar3;
  auVar16._0_4_ = fVar23;
  auVar29._0_8_ = auVar16._0_8_ << 0x20;
  auVar29._8_4_ = fVar22;
  auVar29._12_4_ = fVar23;
  auVar17._4_8_ = auVar29._8_8_;
  auVar17._0_4_ = -(uint)(fVar23 < fVar25);
  auVar30._0_8_ = auVar17._0_8_ << 0x20;
  auVar30._8_4_ = -(uint)(fVar22 < fVar24);
  auVar30._12_4_ = -(uint)(fVar23 < fVar25);
  uVar15 = CONCAT44(fVar23,fVar22) & auVar30._8_8_;
  auVar31._0_8_ = ~uVar26 & CONCAT44(fVar25,fVar24);
  auVar31._8_8_ = ~auVar30._8_8_ & CONCAT44(fVar25,fVar24);
  auVar12._8_4_ = (int)uVar15;
  auVar12._0_8_ = CONCAT44(fVar23,fVar22) & uVar26;
  auVar12._12_4_ = (int)(uVar15 >> 0x20);
  auVar31 = auVar31 | auVar12;
  fVar34 = (cull_rect->Min).x;
  auVar33._4_4_ = -(uint)(fVar34 < auVar31._4_4_);
  auVar33._0_4_ = -(uint)((cull_rect->Min).y < auVar31._0_4_);
  auVar18._4_8_ = auVar31._8_8_;
  auVar18._0_4_ = -(uint)(auVar31._4_4_ < fVar34);
  auVar32._0_8_ = auVar18._0_8_ << 0x20;
  auVar32._8_4_ = -(uint)(auVar31._8_4_ < (cull_rect->Max).y);
  auVar32._12_4_ = -(uint)(auVar31._12_4_ < (cull_rect->Max).x);
  auVar33._8_8_ = auVar32._8_8_;
  iVar19 = movmskps((int)cull_rect,auVar33);
  if (iVar19 == 0xf) {
    IVar6 = this->Col;
    IVar1 = *uv;
    fVar27 = fVar24 - fVar22;
    fVar34 = fVar25 - fVar23;
    fVar28 = fVar34 * fVar34 + fVar27 * fVar27;
    if (0.0 < fVar28) {
      fVar28 = 1.0 / SQRT(fVar28);
      fVar34 = fVar34 * fVar28;
      fVar27 = fVar27 * fVar28;
    }
    fVar28 = this->Weight * 0.5;
    pIVar10 = DrawList->_VtxWritePtr;
    fVar34 = fVar28 * fVar34;
    fVar28 = fVar28 * fVar27;
    (pIVar10->pos).x = fVar28 + fVar23;
    (pIVar10->pos).y = fVar22 - fVar34;
    (pIVar10->uv).x = IVar1.x;
    (pIVar10->uv).y = IVar1.y;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10->col = IVar6;
    pIVar10[1].pos.x = fVar28 + fVar25;
    pIVar10[1].pos.y = fVar24 - fVar34;
    pIVar10[1].uv = IVar1;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[1].col = IVar6;
    pIVar10[2].pos.x = fVar25 - fVar28;
    pIVar10[2].pos.y = fVar34 + fVar24;
    pIVar10[2].uv = IVar1;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[2].col = IVar6;
    pIVar10[3].pos.x = fVar23 - fVar28;
    pIVar10[3].pos.y = fVar34 + fVar22;
    pIVar10[3].uv = IVar1;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[3].col = IVar6;
    DrawList->_VtxWritePtr = pIVar10 + 4;
    uVar7 = DrawList->_VtxCurrentIdx;
    pIVar11 = DrawList->_IdxWritePtr;
    IVar21 = (ImDrawIdx)uVar7;
    *pIVar11 = IVar21;
    pIVar11[1] = IVar21 + 1;
    pIVar11[2] = IVar21 + 2;
    pIVar11[3] = IVar21;
    pIVar11[4] = IVar21 + 2;
    pIVar11[5] = IVar21 + 3;
    DrawList->_IdxWritePtr = pIVar11 + 6;
    DrawList->_VtxCurrentIdx = uVar7 + 4;
  }
  return (char)iVar19 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }